

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O0

int __thiscall
glslang::TDefaultIoResolverBase::reserveSlot(TDefaultIoResolverBase *this,int set,int slot,int size)

{
  bool bVar1;
  mapped_type *pmVar2;
  reference piVar3;
  bool bVar4;
  int local_4c;
  const_iterator local_48;
  int *local_40;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  int local_2c;
  iterator iStack_28;
  int i;
  iterator at;
  int size_local;
  int slot_local;
  int set_local;
  TDefaultIoResolverBase *this_local;
  
  at._M_current._4_4_ = size;
  size_local = set;
  _slot_local = this;
  iStack_28 = findSlot(this,set,slot);
  for (local_2c = 0; local_2c < at._M_current._4_4_; local_2c = local_2c + 1) {
    pmVar2 = std::
             unordered_map<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
             ::operator[](&this->slots,&size_local);
    local_38._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(pmVar2);
    bVar1 = __gnu_cxx::operator==(&stack0xffffffffffffffd8,&local_38);
    bVar4 = true;
    if (!bVar1) {
      piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&stack0xffffffffffffffd8);
      bVar4 = *piVar3 != slot + local_2c;
    }
    if (bVar4) {
      pmVar2 = std::
               unordered_map<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               ::operator[](&this->slots,&size_local);
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_48,
                 &stack0xffffffffffffffd8);
      local_4c = slot + local_2c;
      local_40 = (int *)std::vector<int,_std::allocator<int>_>::insert(pmVar2,local_48,&local_4c);
      iStack_28 = (iterator)local_40;
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&stack0xffffffffffffffd8);
  }
  return slot;
}

Assistant:

int TDefaultIoResolverBase::reserveSlot(int set, int slot, int size) {
    TSlotSet::iterator at = findSlot(set, slot);
    // tolerate aliasing, by not double-recording aliases
    // (policy about appropriateness of the alias is higher up)
    for (int i = 0; i < size; i++) {
        if (at == slots[set].end() || *at != slot + i)
            at = slots[set].insert(at, slot + i);
        ++at;
    }
    return slot;
}